

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall cfd::core::Address::CalculateP2WSH(Address *this,string *bech32_hrp)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData local_70;
  ByteData local_48;
  undefined1 local_30 [8];
  ByteData256 script_hash;
  string *bech32_hrp_local;
  Address *this_local;
  
  script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bech32_hrp;
  Script::GetData(&local_48,&this->redeem_script_);
  HashUtil::Sha256((ByteData256 *)local_30,&local_48);
  ByteData::~ByteData(&local_48);
  CalculateP2WSH(this,(ByteData256 *)local_30,
                 (string *)
                 script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData256::GetBytes(&local_88,(ByteData256 *)local_30);
  ByteData::ByteData(&local_70,&local_88);
  ByteData::operator=(&this->hash_,&local_70);
  ByteData::~ByteData(&local_70);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  ByteData256::~ByteData256((ByteData256 *)local_30);
  return;
}

Assistant:

void Address::CalculateP2WSH(const std::string& bech32_hrp) {
  ByteData256 script_hash = HashUtil::Sha256(redeem_script_.GetData());
  CalculateP2WSH(script_hash, bech32_hrp);
  hash_ = ByteData(script_hash.GetBytes());
}